

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveOnSurface.h
# Opt level: O1

Index __thiscall
anurbs::
CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
::degree(CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
         *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar2;
  long *__result;
  long *plVar3;
  long local_28 [3];
  
  plVar3 = local_28;
  iVar1 = (*(((this->m_curve_geometry).
              super___shared_ptr<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->super_CurveBase<2L>)._vptr_CurveBase[2])();
  local_28[0] = CONCAT44(extraout_var,iVar1);
  iVar1 = (*(((this->m_surface_geometry).
              super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_SurfaceBase<3L>)._vptr_SurfaceBase[2])();
  local_28[1] = CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*(((this->m_surface_geometry).
              super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_SurfaceBase<3L>)._vptr_SurfaceBase[3])();
  local_28[2] = CONCAT44(extraout_var_01,iVar1);
  lVar2 = 8;
  do {
    if (*plVar3 < *(long *)((long)local_28 + lVar2)) {
      plVar3 = (long *)((long)local_28 + lVar2);
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  return *plVar3;
}

Assistant:

Index degree() const override
    {
        return std::max({m_curve_geometry->degree(),
            m_surface_geometry->degree_u(), m_surface_geometry->degree_v()});
    }